

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O2

void re_fastputc(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wint_t **ppwVar3;
  wint_t *pwVar4;
  wint_t c_00;
  int iVar5;
  long lVar6;
  wint_t c_01;
  wchar_t wVar7;
  wchar_t *dst;
  
  iVar5 = wcwidth(c);
  if (1 < iVar5) {
    while ((el->el_terminal).t_size.h < (el->el_cursor).h + iVar5) {
      re_fastputc(el,0x20);
    }
  }
  terminal__putc(el,c);
  ppwVar3 = el->el_display;
  iVar5 = iVar5 + 1;
  do {
    pwVar4 = ppwVar3[(el->el_cursor).v];
    wVar1 = (el->el_cursor).h;
    (el->el_cursor).h = wVar1 + L'\x01';
    pwVar4[wVar1] = c;
    iVar5 = iVar5 + -1;
    c = 0xffffffff;
  } while (1 < iVar5);
  wVar1 = (el->el_terminal).t_size.h;
  if ((el->el_cursor).h < wVar1) {
    return;
  }
  (el->el_cursor).h = L'\0';
  wVar7 = (el->el_cursor).v + L'\x01';
  wVar2 = (el->el_terminal).t_size.v;
  if (wVar7 < wVar2) {
    (el->el_cursor).v = wVar7;
    wVar2 = (el->el_refresh).r_oldcv;
    (el->el_refresh).r_oldcv = wVar2 + L'\x01';
    dst = (wchar_t *)ppwVar3[(long)wVar2 + 1];
  }
  else {
    dst = (wchar_t *)*ppwVar3;
    for (lVar6 = 1; ppwVar3 = el->el_display, lVar6 < wVar2; lVar6 = lVar6 + 1) {
      ppwVar3[lVar6 + -1] = ppwVar3[lVar6];
    }
    ppwVar3[lVar6 + -1] = (wint_t *)dst;
  }
  re__copy_and_pad(dst,anon_var_dwarf_16e07 + 3,(long)wVar1);
  wVar1 = (el->el_terminal).t_flags;
  if ((char)wVar1 < '\0') {
    if (((uint)wVar1 >> 8 & 1) == 0) {
      return;
    }
    c_01 = 8;
    c_00 = 0x20;
  }
  else {
    c_01 = 10;
    c_00 = 0xd;
  }
  terminal__putc(el,c_00);
  terminal__putc(el,c_01);
  return;
}

Assistant:

static void
re_fastputc(EditLine *el, wint_t c)
{
	wint_t *lastline;
	int w;

	w = wcwidth(c);
	while (w > 1 && el->el_cursor.h + w > el->el_terminal.t_size.h)
	    re_fastputc(el, ' ');

	terminal__putc(el, c);
	el->el_display[el->el_cursor.v][el->el_cursor.h++] = c;
	while (--w > 0)
		el->el_display[el->el_cursor.v][el->el_cursor.h++]
			= MB_FILL_CHAR;

	if (el->el_cursor.h >= el->el_terminal.t_size.h) {
		/* if we must overflow */
		el->el_cursor.h = 0;

		/*
		 * If we would overflow (input is longer than terminal size),
		 * emulate scroll by dropping first line and shuffling the rest.
		 * We do this via pointer shuffling - it's safe in this case
		 * and we avoid memcpy().
		 */
		if (el->el_cursor.v + 1 >= el->el_terminal.t_size.v) {
			int i, lins = el->el_terminal.t_size.v;

			lastline = el->el_display[0];
			for(i = 1; i < lins; i++)
				el->el_display[i - 1] = el->el_display[i];

			el->el_display[i - 1] = lastline;
		} else {
			el->el_cursor.v++;
			lastline = el->el_display[++el->el_refresh.r_oldcv];
		}
		re__copy_and_pad((wchar_t *)lastline, L"",
		    (size_t)el->el_terminal.t_size.h);

		if (EL_HAS_AUTO_MARGINS) {
			if (EL_HAS_MAGIC_MARGINS) {
				terminal__putc(el, ' ');
				terminal__putc(el, '\b');
			}
		} else {
			terminal__putc(el, '\r');
			terminal__putc(el, '\n');
		}
	}
}